

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store_halfword.c
# Opt level: O0

void load_store_byte_halfword(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort *in_RSI;
  undefined8 *in_RDI;
  uint32_t value_3;
  uint16_t rddata;
  uint32_t address;
  load_store_byte_halfword_t *instr;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  undefined8 in_stack_fffffffffffffed8;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffffee0;
  uint local_dc;
  undefined2 local_b8;
  int local_a8;
  int local_98;
  int local_6c;
  int local_5c;
  undefined2 local_4c;
  int local_3c;
  int local_2c;
  undefined2 local_20;
  
  uVar2 = (uint)(*in_RSI >> 3 & 7);
  if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_98 = *(int *)((long)in_RDI + (ulong)(uVar2 - 8) * 4 + 0x6c);
  }
  else if (uVar2 < 0xd) {
    local_98 = *(int *)((long)in_RDI + (ulong)uVar2 * 4 + 0x38);
  }
  else if (uVar2 == 0xd) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_6c = *(int *)((long)in_RDI + 0x84);
      break;
    case 0x12:
      local_6c = *(int *)(in_RDI + 0x12);
      break;
    case 0x13:
      local_6c = *(int *)(in_RDI + 0x11);
      break;
    default:
      local_6c = *(int *)(in_RDI + 0x10);
      break;
    case 0x17:
      local_6c = *(int *)((long)in_RDI + 0x8c);
      break;
    case 0x1b:
      local_6c = *(int *)((long)in_RDI + 0x94);
    }
    local_98 = local_6c;
  }
  else if (uVar2 == 0xe) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_3c = *(int *)((long)in_RDI + 0x9c);
      break;
    case 0x12:
      local_3c = *(int *)(in_RDI + 0x15);
      break;
    case 0x13:
      local_3c = *(int *)(in_RDI + 0x14);
      break;
    default:
      local_3c = *(int *)(in_RDI + 0x13);
      break;
    case 0x17:
      local_3c = *(int *)((long)in_RDI + 0xa4);
      break;
    case 0x1b:
      local_3c = *(int *)((long)in_RDI + 0xac);
    }
    local_98 = local_3c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_98 = *(int *)(in_RDI + 0x16);
  }
  uVar2 = (uint)(*in_RSI >> 6 & 7);
  if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_a8 = *(int *)((long)in_RDI + (ulong)(uVar2 - 8) * 4 + 0x6c);
  }
  else if (uVar2 < 0xd) {
    local_a8 = *(int *)((long)in_RDI + (ulong)uVar2 * 4 + 0x38);
  }
  else if (uVar2 == 0xd) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_5c = *(int *)((long)in_RDI + 0x84);
      break;
    case 0x12:
      local_5c = *(int *)(in_RDI + 0x12);
      break;
    case 0x13:
      local_5c = *(int *)(in_RDI + 0x11);
      break;
    default:
      local_5c = *(int *)(in_RDI + 0x10);
      break;
    case 0x17:
      local_5c = *(int *)((long)in_RDI + 0x8c);
      break;
    case 0x1b:
      local_5c = *(int *)((long)in_RDI + 0x94);
    }
    local_a8 = local_5c;
  }
  else if (uVar2 == 0xe) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_2c = *(int *)((long)in_RDI + 0x9c);
      break;
    case 0x12:
      local_2c = *(int *)(in_RDI + 0x15);
      break;
    case 0x13:
      local_2c = *(int *)(in_RDI + 0x14);
      break;
    default:
      local_2c = *(int *)(in_RDI + 0x13);
      break;
    case 0x17:
      local_2c = *(int *)((long)in_RDI + 0xa4);
      break;
    case 0x1b:
      local_2c = *(int *)((long)in_RDI + 0xac);
    }
    local_a8 = local_2c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_a8 = *(int *)(in_RDI + 0x16);
  }
  uVar2 = local_98 + local_a8;
  if ((((byte)(*in_RSI >> 10) & 1) == 0) && (((byte)(*in_RSI >> 0xb) & 1) == 0)) {
    uVar3 = (uint)(*in_RSI & 7);
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar3)) && (uVar3 < 0xd)) {
      local_b8 = (undefined2)*(undefined4 *)((long)in_RDI + (ulong)(uVar3 - 8) * 4 + 0x6c);
    }
    else if (uVar3 < 0xd) {
      local_b8 = (undefined2)*(undefined4 *)((long)in_RDI + (ulong)uVar3 * 4 + 0x38);
    }
    else if (uVar3 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_4c = (undefined2)*(undefined4 *)((long)in_RDI + 0x84);
        break;
      case 0x12:
        local_4c = (undefined2)*(undefined4 *)(in_RDI + 0x12);
        break;
      case 0x13:
        local_4c = (undefined2)*(undefined4 *)(in_RDI + 0x11);
        break;
      default:
        local_4c = (undefined2)*(undefined4 *)(in_RDI + 0x10);
        break;
      case 0x17:
        local_4c = (undefined2)*(undefined4 *)((long)in_RDI + 0x8c);
        break;
      case 0x1b:
        local_4c = (undefined2)*(undefined4 *)((long)in_RDI + 0x94);
      }
      local_b8 = local_4c;
    }
    else if (uVar3 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_20 = (undefined2)*(undefined4 *)((long)in_RDI + 0x9c);
        break;
      case 0x12:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0x15);
        break;
      case 0x13:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0x14);
        break;
      default:
        local_20 = (undefined2)*(undefined4 *)(in_RDI + 0x13);
        break;
      case 0x17:
        local_20 = (undefined2)*(undefined4 *)((long)in_RDI + 0xa4);
        break;
      case 0x1b:
        local_20 = (undefined2)*(undefined4 *)((long)in_RDI + 0xac);
      }
      local_b8 = local_20;
    }
    else {
      if (uVar3 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar3);
        exit(1);
      }
      local_b8 = (undefined2)*(undefined4 *)(in_RDI + 0x16);
    }
    (*(code *)in_RDI[4])(uVar2,local_b8,2);
  }
  else {
    if ((*in_RSI >> 0xb & 1) == 0) {
      (*(code *)*in_RDI)(uVar2,2);
      local_dc = sign_extend_word((uint32_t)in_stack_fffffffffffffee0,
                                  (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                  (int)in_stack_fffffffffffffed8);
      new_pc = (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      (*(code *)in_RDI[6])(1);
    }
    else if ((*in_RSI >> 10 & 1) == 0) {
      uVar1 = (*(code *)in_RDI[1])(uVar2,2);
      new_pc = (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      local_dc = arm_ror((status_register_t *)0x0,(uint)uVar1,(uVar2 & 1) << 3);
      (*(code *)in_RDI[6])(1);
    }
    else if ((uVar2 & 1) == 0) {
      (*(code *)in_RDI[1])(uVar2,2);
      local_dc = sign_extend_word((uint32_t)in_stack_fffffffffffffee0,
                                  (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                  (int)in_stack_fffffffffffffed8);
      new_pc = (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      (*(code *)in_RDI[6])(1);
    }
    else {
      (*(code *)*in_RDI)(uVar2,2);
      local_dc = sign_extend_word((uint32_t)in_stack_fffffffffffffee0,
                                  (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                  (int)in_stack_fffffffffffffed8);
      new_pc = (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      (*(code *)in_RDI[6])(1);
    }
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)local_dc);
    }
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      *(uint *)((long)in_RDI + (ulong)(uVar2 - 8) * 4 + 0x6c) = local_dc;
    }
    else if (uVar2 < 0xd) {
      *(uint *)((long)in_RDI + (ulong)uVar2 * 4 + 0x38) = local_dc;
    }
    else if (uVar2 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x84) = local_dc;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x12) = local_dc;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x11) = local_dc;
        break;
      default:
        *(uint *)(in_RDI + 0x10) = local_dc;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0x8c) = local_dc;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0x94) = local_dc;
      }
    }
    else if (uVar2 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x9c) = local_dc;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x15) = local_dc;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x14) = local_dc;
        break;
      default:
        *(uint *)(in_RDI + 0x13) = local_dc;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0xa4) = local_dc;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0xac) = local_dc;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffee0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffee0,new_pc);
      }
    }
  }
  return;
}

Assistant:

void load_store_byte_halfword(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_store_byte_halfword_t* instr = &thminstr->LOAD_STORE_BYTE_HALFWORD;
    word address = get_register(state, instr->rb) + get_register(state, instr->ro);
    if (instr->s == 0 && instr->h == 0) {
        half rddata = get_register(state, instr->rd) & 0xFFFF;
        state->write_half(address, rddata, ACCESS_NONSEQUENTIAL);
    } else {
        word value;
        if (instr->h) {
            if (instr->s) {
                if (address & 1) {
                    value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
                    value = sign_extend_word(value, 8, 32);
                    state->cpu_idle(1);
                } else {
                    value = state->read_half(address, ACCESS_NONSEQUENTIAL);
                    value = sign_extend_word(value, 16, 32);
                    state->cpu_idle(1);
                }
            } else {
                value = state->read_half(address, ACCESS_NONSEQUENTIAL);
                value = arm_ror(NULL, value, (address & 0x1) << 3);
                state->cpu_idle(1);
            }
        } else {
            value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
            value = sign_extend_word(value, 8, 32);
            state->cpu_idle(1);
        }

        set_register(state, instr->rd, value);
    }
}